

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void setAllPagerFlags(sqlite3 *db)

{
  int iVar1;
  u8 *puVar2;
  
  if ((db->autoCommit != '\0') && (0 < db->nDb)) {
    iVar1 = db->nDb + 1;
    puVar2 = &db->aDb->safety_level;
    do {
      if (*(Btree **)(puVar2 + -8) != (Btree *)0x0) {
        sqlite3BtreeSetPagerFlags(*(Btree **)(puVar2 + -8),db->flags & 0x1cU | (uint)*puVar2);
      }
      iVar1 = iVar1 + -1;
      puVar2 = puVar2 + 0x20;
    } while (1 < iVar1);
  }
  return;
}

Assistant:

static void setAllPagerFlags(sqlite3 *db){
  if( db->autoCommit ){
    Db *pDb = db->aDb;
    int n = db->nDb;
    assert( SQLITE_FullFSync==PAGER_FULLFSYNC );
    assert( SQLITE_CkptFullFSync==PAGER_CKPT_FULLFSYNC );
    assert( SQLITE_CacheSpill==PAGER_CACHESPILL );
    assert( (PAGER_FULLFSYNC | PAGER_CKPT_FULLFSYNC | PAGER_CACHESPILL)
             ==  PAGER_FLAGS_MASK );
    assert( (pDb->safety_level & PAGER_SYNCHRONOUS_MASK)==pDb->safety_level );
    while( (n--) > 0 ){
      if( pDb->pBt ){
        sqlite3BtreeSetPagerFlags(pDb->pBt,
                 pDb->safety_level | (db->flags & PAGER_FLAGS_MASK) );
      }
      pDb++;
    }
  }
}